

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall PClassPlayerPawn::PClassPlayerPawn(PClassPlayerPawn *this)

{
  FString *local_58;
  ulong local_28;
  size_t i;
  PClassPlayerPawn *this_local;
  
  PClassActor::PClassActor(&this->super_PClassActor);
  *(undefined ***)
   &(this->super_PClassActor).super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType = &PTR_StaticType_009fb998;
  FString::FString(&this->DisplayName);
  FString::FString(&this->SoundClass);
  FString::FString(&this->Face);
  FString::FString(&this->Portrait);
  local_58 = this->Slot;
  do {
    FString::FString(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != (FString *)&this->InvulMode);
  FName::FName(&this->InvulMode);
  FName::FName(&this->HealingRadiusType);
  TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::TMap
            (&this->ColorSets);
  TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_>::TMap(&this->PainFlashes);
  for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
    this->HexenArmor[local_28] = 0.0;
  }
  this->ColorRangeStart = '\0';
  this->ColorRangeEnd = '\0';
  return;
}

Assistant:

PClassPlayerPawn::PClassPlayerPawn()
{
	for (size_t i = 0; i < countof(HexenArmor); ++i)
	{
		HexenArmor[i] = 0;
	}
	ColorRangeStart = 0;
	ColorRangeEnd = 0;
}